

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

void __thiscall
chrono::ChBezierCurve::ChBezierCurve
          (ChBezierCurve *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_00;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_01;
  ulong n;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pointer pCVar12;
  pointer pCVar13;
  pointer pCVar14;
  pointer pCVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  ulong __new_size;
  double *rhs;
  double *x;
  double *x_00;
  double *x_01;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_points,points);
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar21 = (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  __new_size = lVar21 / 0x18;
  if (__new_size < 2) {
    __assert_fail("numPoints > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                  ,0x4c,"chrono::ChBezierCurve::ChBezierCurve(const std::vector<ChVector<>> &)");
  }
  this_00 = &this->m_inCV;
  this_01 = &this->m_outCV;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_00,__new_size);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_01,__new_size);
  pCVar12 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar13 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar12 != pCVar13) {
    pCVar13->m_data[0] = pCVar12->m_data[0];
    pCVar13->m_data[1] = pCVar12->m_data[1];
    pCVar13->m_data[2] = pCVar12->m_data[2];
  }
  n = __new_size - 1;
  pCVar14 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar15 = pCVar12 + n;
  if (pCVar12 != pCVar14) {
    pCVar14[n].m_data[0] = pCVar15->m_data[0];
    pCVar14[n].m_data[1] = pCVar15->m_data[1];
    pCVar14[n].m_data[2] = pCVar15->m_data[2];
  }
  if (lVar21 == 0x30) {
    dVar1 = pCVar12->m_data[2];
    dVar17 = pCVar12->m_data[1];
    dVar2 = pCVar12[1].m_data[2];
    dVar18 = pCVar12[1].m_data[1];
    pCVar14->m_data[0] =
         (pCVar12->m_data[0] + pCVar12->m_data[0] + pCVar12[1].m_data[0]) * 0.3333333333333333;
    pCVar14->m_data[1] = (dVar17 + dVar17 + dVar18) * 0.3333333333333333;
    pCVar14->m_data[2] = (dVar1 + dVar1 + dVar2) * 0.3333333333333333;
    dVar1 = pCVar12[1].m_data[2];
    dVar2 = pCVar12->m_data[2];
    dVar17 = pCVar12[1].m_data[1];
    dVar18 = pCVar12->m_data[1];
    pCVar13[1].m_data[0] =
         (pCVar12[1].m_data[0] + pCVar12[1].m_data[0] + pCVar12->m_data[0]) * 0.3333333333333333;
    pCVar13[1].m_data[1] = (dVar17 + dVar17 + dVar18) * 0.3333333333333333;
    pCVar13[1].m_data[2] = (dVar1 + dVar1 + dVar2) * 0.3333333333333333;
    return;
  }
  uVar23 = -(ulong)(n >> 0x3d != 0) | n * 8;
  rhs = (double *)operator_new__(uVar23);
  x = (double *)operator_new__(uVar23);
  x_00 = (double *)operator_new__(uVar23);
  x_01 = (double *)operator_new__(uVar23);
  uVar23 = __new_size - 2;
  pCVar13 = pCVar12;
  for (uVar19 = 1; uVar19 < uVar23; uVar19 = uVar19 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pCVar13[1].m_data[0];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = pCVar13[2].m_data[0] + pCVar13[2].m_data[0];
    auVar24 = vfmadd231sd_fma(auVar25,ZEXT816(0x4010000000000000),auVar3);
    rhs[uVar19] = auVar24._0_8_;
    pCVar13 = pCVar13 + 1;
  }
  auVar26._8_8_ = 0;
  auVar26._0_8_ = pCVar12[1].m_data[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = pCVar12->m_data[0];
  auVar24 = vfmadd213sd_fma(auVar26,ZEXT816(0x4000000000000000),auVar24);
  *rhs = auVar24._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = pCVar12[uVar23].m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pCVar15->m_data[0];
  auVar24 = vfmadd213sd_fma(auVar27,ZEXT816(0x4020000000000000),auVar4);
  rhs[__new_size - 2] = auVar24._0_8_ * 0.5;
  solveTriDiag(n,rhs,x);
  pCVar12 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pdVar20 = pCVar12[2].m_data + 1;
  for (uVar19 = 1; uVar19 < uVar23; uVar19 = uVar19 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar20[-3];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *pdVar20 + *pdVar20;
    auVar24 = vfmadd231sd_fma(auVar28,ZEXT816(0x4010000000000000),auVar5);
    pdVar20 = pdVar20 + 3;
    rhs[uVar19] = auVar24._0_8_;
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ = pCVar12[1].m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pCVar12->m_data[1];
  auVar24 = vfmadd213sd_fma(auVar29,ZEXT816(0x4000000000000000),auVar6);
  *rhs = auVar24._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = pCVar12[uVar23].m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pCVar12[n].m_data[1];
  auVar24 = vfmadd213sd_fma(auVar30,ZEXT816(0x4020000000000000),auVar7);
  rhs[__new_size - 2] = auVar24._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_00);
  pCVar12 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pdVar20 = pCVar12[2].m_data + 2;
  for (uVar19 = 1; uVar19 < uVar23; uVar19 = uVar19 + 1) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pdVar20[-3];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *pdVar20 + *pdVar20;
    auVar24 = vfmadd231sd_fma(auVar31,ZEXT816(0x4010000000000000),auVar8);
    pdVar20 = pdVar20 + 3;
    rhs[uVar19] = auVar24._0_8_;
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = pCVar12[1].m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pCVar12->m_data[2];
  auVar24 = vfmadd213sd_fma(auVar32,ZEXT816(0x4000000000000000),auVar9);
  *rhs = auVar24._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = pCVar12[uVar23].m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pCVar12[n].m_data[2];
  auVar24 = vfmadd213sd_fma(ZEXT816(0x4020000000000000),auVar33,auVar10);
  rhs[__new_size - 2] = auVar24._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_01);
  pCVar12 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar13 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar15 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar19 = 2;
  auVar34._8_8_ = 0x4000000000000000;
  auVar34._0_8_ = 0x4000000000000000;
  uVar22 = uVar19;
  while (__new_size != uVar22) {
    dVar1 = x_00[uVar22 - 2];
    dVar2 = x_01[uVar22 - 2];
    pCVar12->m_data[uVar19 - 2] = x[uVar22 - 2];
    pCVar12->m_data[uVar19 - 1] = dVar1;
    pCVar12->m_data[uVar19] = dVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = x[uVar22 - 1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = pCVar13[1].m_data[uVar19];
    auVar24 = vmovhpd_avx(auVar39,x_00[uVar22 - 1]);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = x_01[uVar22 - 1];
    auVar4 = vfmsub213sd_fma(auVar37,ZEXT816(0x4000000000000000),auVar11);
    uVar22 = uVar22 + 1;
    auVar24 = vfmsub231pd_fma(auVar24,auVar34,*(undefined1 (*) [16])(pCVar13->m_data + uVar19 + 1));
    *(undefined1 (*) [16])(pCVar15->m_data + uVar19 + 1) = auVar24;
    pCVar15[1].m_data[uVar19] = auVar4._0_8_;
    uVar19 = uVar19 + 3;
  }
  auVar35._8_8_ = 0;
  auVar35._0_8_ = x[__new_size - 2];
  dVar1 = x_00[__new_size - 2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1;
  dVar2 = x_01[__new_size - 2];
  pCVar12 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar12[uVar23].m_data[0] = x[__new_size - 2];
  pCVar12[uVar23].m_data[1] = dVar1;
  pCVar12[uVar23].m_data[2] = dVar2;
  auVar24 = vunpcklpd_avx(auVar35,auVar38);
  pCVar12 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar13 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pCVar12[n].m_data[2];
  pCVar12 = pCVar12 + n;
  auVar36._0_8_ = auVar24._0_8_ + pCVar12->m_data[0];
  auVar36._8_8_ = auVar24._8_8_ + pCVar12->m_data[1];
  auVar16._8_8_ = 0x3fe0000000000000;
  auVar16._0_8_ = 0x3fe0000000000000;
  auVar24 = vmulpd_avx512vl(auVar36,auVar16);
  *(undefined1 (*) [16])pCVar13[n].m_data = auVar24;
  pCVar13[n].m_data[2] = (dVar2 + dVar1) * 0.5;
  operator_delete__(rhs);
  operator_delete__(x);
  operator_delete__(x_00);
  operator_delete__(x_01);
  return;
}

Assistant:

ChBezierCurve::ChBezierCurve(const std::vector<ChVector<> >& points) : m_points(points) {
    size_t numPoints = points.size();
    assert(numPoints > 1);

    m_inCV.resize(numPoints);
    m_outCV.resize(numPoints);

    m_inCV[0] = points[0];
    m_outCV[numPoints - 1] = points[numPoints - 1];

    // Special case for two points only.  In this case, the curve should be a
    // straight line.
    if (numPoints == 2) {
        m_outCV[0] = (2.0 * points[0] + points[1]) / 3.0;
        m_inCV[1] = (points[0] + 2.0 * points[1]) / 3.0;
        return;
    }

    /*
    // Calculate control points
    // Use heuristic approach from http://www.antigrain.com/research/bezier_interpolation/index.html

    //// NOTE: Does not produce a proper Bezier vurve and as such requires a different eval() function!!!

    static const double smooth_value = 0.2;

    // Calculate centers and lengths
    size_t numIntervals = numPoints - 1;
    std::vector<ChVector<>> center(numIntervals);
    std::vector<double> length(numIntervals);
    for (int i = 0; i < numIntervals; i++) {
        center[i] = (points[i] + points[i + 1]) / 2;
        length[i] = (points[i + 1] - points[i]).Length();
    }

    // Calculate control points
    for (size_t i = 0; i < numIntervals; i++) {
        // Interval i: [p(i), p(i+1)] -> set outCV(i) & inCV(i+1)

        double len1 = (i == 0) ? 0 : length[i-1];
        double len2 = length[i];
        double len3 = (i == numIntervals - 1) ? 0 : length[i + 1];

        auto c1 = (i == 0) ? points[0] : center[i - 1];
        auto c2 = center[i];
        auto c3 = (i == numIntervals - 1) ? points[i + 1] : center[i + 1];

        double k1 = len1 / (len1 + len2);
        double k2 = len2 / (len2 + len3);

        auto m1 = c1 + (c2 - c1) * k1;
        auto m2 = c2 + (c2 - c2) * k2;

        m_outCV[i] = m1 + (c2 - m1) * smooth_value + points[i] - m1;
        m_inCV[i + 1] = m2 + (c2 - m2) * smooth_value + points[i + 1] - m2;
    }
    */

    // Calculate coordinates of the outCV control points.
    size_t n = numPoints - 1;
    double* rhs = new double[n];
    double* x = new double[n];
    double* y = new double[n];
    double* z = new double[n];

    // X coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].x() + 2 * points[i + 1].x();
    rhs[0] = points[0].x() + 2 * points[1].x();
    rhs[n - 1] = (8 * points[n - 1].x() + points[n].x()) / 2;
    solveTriDiag(n, rhs, x);

    // Y coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].y() + 2 * points[i + 1].y();
    rhs[0] = points[0].y() + 2 * points[1].y();
    rhs[n - 1] = (8 * points[n - 1].y() + points[n].y()) / 2;
    solveTriDiag(n, rhs, y);

    // Z coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].z() + 2 * points[i + 1].z();
    rhs[0] = points[0].z() + 2 * points[1].z();
    rhs[n - 1] = (8 * points[n - 1].z() + points[n].z()) / 2;
    solveTriDiag(n, rhs, z);

    // Set control points outCV and inCV.
    for (size_t i = 0; i < n - 1; i++) {
        m_outCV[i] = ChVector<>(x[i], y[i], z[i]);
        m_inCV[i + 1] =
            ChVector<>(2 * points[i + 1].x() - x[i + 1], 2 * points[i + 1].y() - y[i + 1], 2 * points[i + 1].z() - z[i + 1]);
    }
    m_outCV[n - 1] = ChVector<>(x[n - 1], y[n - 1], z[n - 1]);
    m_inCV[n] = ChVector<>((points[n].x() + x[n - 1]) / 2, (points[n].y() + y[n - 1]) / 2, (points[n].z() + z[n - 1]) / 2);

    // Cleanup.
    delete[] rhs;
    delete[] x;
    delete[] y;
    delete[] z;
}